

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarTable.cpp
# Opt level: O2

string * ltrim(string *s)

{
  _Iter_pred<ltrim(std::__cxx11::string&)::__0> *p_Var1;
  bool bVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  size_type sVar4;
  _Iter_pred<ltrim(std::__cxx11::string&)::__0> *this;
  _Iter_pred<ltrim(std::__cxx11::string&)::__0> *p_Var5;
  
  this = (_Iter_pred<ltrim(std::__cxx11::string&)::__0> *)(s->_M_dataplus)._M_p;
  sVar4 = s->_M_string_length;
  p_Var1 = this + sVar4;
  for (lVar3 = (long)sVar4 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()(this,in_RSI)
    ;
    p_Var5 = this;
    if (bVar2) goto LAB_00105890;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()
                      (this + 1,in_RSI);
    p_Var5 = this + 1;
    if (bVar2) goto LAB_00105890;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()
                      (this + 2,in_RSI);
    p_Var5 = this + 2;
    if (bVar2) goto LAB_00105890;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()
                      (this + 3,in_RSI);
    p_Var5 = this + 3;
    if (bVar2) goto LAB_00105890;
    this = this + 4;
    sVar4 = sVar4 - 4;
  }
  if (sVar4 != 1) {
    if (sVar4 != 2) {
      p_Var5 = p_Var1;
      if ((sVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()
                            (this,in_RSI), p_Var5 = this, bVar2)) goto LAB_00105890;
      this = this + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()(this,in_RSI)
    ;
    p_Var5 = this;
    if (bVar2) goto LAB_00105890;
    this = this + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_pred<ltrim(std::__cxx11::string&)::$_0>::operator()(this,in_RSI);
  p_Var5 = p_Var1;
  if (bVar2) {
    p_Var5 = this;
  }
LAB_00105890:
  std::__cxx11::string::erase(s,(s->_M_dataplus)._M_p,p_Var5);
  return s;
}

Assistant:

std::string &ltrim(std::string &s)
{
    auto it = std::find_if(s.begin(), s.end(),
                           [](char c)
                           {
                               return !std::isspace<char>(c, std::locale::classic());
                           });
    s.erase(s.begin(), it);
    return s;
}